

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

Node<QSimplexVariable_*,_double> * __thiscall
QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable*,double>>::findNode<QSimplexVariable*>
          (Data<QHashPrivate::Node<QSimplexVariable*,double>> *this,QSimplexVariable **key)

{
  byte bVar1;
  Node<QSimplexVariable_*,_double> *pNVar2;
  Bucket BVar3;
  
  BVar3 = findBucket<QSimplexVariable*>(this,key);
  bVar1 = (BVar3.span)->offsets[BVar3.index];
  if (bVar1 == 0xff) {
    pNVar2 = (Node<QSimplexVariable_*,_double> *)0x0;
  }
  else {
    pNVar2 = (Node<QSimplexVariable_*,_double> *)((BVar3.span)->entries + bVar1);
  }
  return pNVar2;
}

Assistant:

Node *findNode(const K &key) const noexcept
    {
        auto bucket = findBucket(key);
        if (bucket.isUnused())
            return nullptr;
        return bucket.node();
    }